

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void Node_AddNotify_Update(node *Node,dataid Id,notifyproc Func,void *Refered)

{
  undefined1 local_38 [8];
  nodeevt Pin;
  void *Refered_local;
  notifyproc Func_local;
  dataid Id_local;
  node *Node_local;
  
  Pin.Id = (dataid)Refered;
  Node_AddNotify(Node,Id,Func,Refered);
  if (Func != (notifyproc)0x0) {
    local_38 = (undefined1  [8])Node;
    Pin.Node = (node *)Id;
    (*Func)((void *)Pin.Id,(nodeevt *)local_38);
  }
  return;
}

Assistant:

void Node_AddNotify_Update(node* Node, dataid Id, notifyproc Func, void* Refered)
{
    Node_AddNotify(Node,Id,Func,Refered);
    if (Func)
    {
        nodeevt Pin;
        Pin.Node = Node;
        Pin.Id = Id;
        Func(Refered,&Pin);
    }
}